

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BFTraceReader.cpp
# Opt level: O2

void __thiscall BFTraceReader::loadCFGs(BFTraceReader *this)

{
  string *psVar1;
  Addr AVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  uint __line;
  bool bVar4;
  Symbol *pSVar5;
  _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
  *this_00;
  CFG *this_01;
  iterator iVar6;
  mapped_type *pmVar7;
  CfgNode *this_02;
  BlockData *pBVar8;
  CfgNode *pCVar9;
  mapped_type *pmVar10;
  _List_iterator<unsigned_long> _Var11;
  _Base_ptr p_Var12;
  _Base_ptr p_Var13;
  undefined4 uVar14;
  _List_node_base *p_Var15;
  char *__assertion;
  Symbol *sym;
  Addr bb_addr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e0;
  string term_type;
  Addr dst_1;
  string keyword;
  list<BFTraceReader::Symbol_*,_std::allocator<BFTraceReader::Symbol_*>_> symbols;
  
  sym = (Symbol *)0x0;
  symbols.super__List_base<BFTraceReader::Symbol_*,_std::allocator<BFTraceReader::Symbol_*>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&symbols;
  symbols.super__List_base<BFTraceReader::Symbol_*,_std::allocator<BFTraceReader::Symbol_*>_>.
  _M_impl._M_node._M_size = 0;
  psVar1 = &(this->m_current).token;
  symbols.super__List_base<BFTraceReader::Symbol_*,_std::allocator<BFTraceReader::Symbol_*>_>.
  _M_impl._M_node.super__List_node_base._M_prev =
       symbols.super__List_base<BFTraceReader::Symbol_*,_std::allocator<BFTraceReader::Symbol_*>_>.
       _M_impl._M_node.super__List_node_base._M_next;
  do {
    if ((this->m_current).type != TKN_KEYWORD) {
      matchToken(this,TKN_EOF);
      p_Var15 = (_List_node_base *)&symbols;
      do {
        p_Var15 = (((_List_base<BFTraceReader::Symbol_*,_std::allocator<BFTraceReader::Symbol_*>_> *
                    )&p_Var15->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
        if (p_Var15 == (_List_node_base *)&symbols) {
          std::__cxx11::
          _List_base<BFTraceReader::Symbol_*,_std::allocator<BFTraceReader::Symbol_*>_>::_M_clear
                    (&symbols.
                      super__List_base<BFTraceReader::Symbol_*,_std::allocator<BFTraceReader::Symbol_*>_>
                    );
          return;
        }
        pSVar5 = (Symbol *)p_Var15[1]._M_next;
        for (p_Var13 = (pSVar5->entries)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var13 != &(pSVar5->entries)._M_t._M_impl.super__Rb_tree_header;
            p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13)) {
          bb_addr = *(Addr *)(p_Var13 + 1);
          this_01 = CFGReader::instance(&this->super_CFGReader,bb_addr);
          std::operator+(&term_type,&pSVar5->filename,"::");
          std::operator+(&keyword,&term_type,&pSVar5->functname);
          CFG::setFunctionName(this_01,&keyword);
          std::__cxx11::string::~string((string *)&keyword);
          std::__cxx11::string::~string((string *)&term_type);
          keyword.field_2._M_allocated_capacity = 0;
          keyword._M_dataplus._M_p = (pointer)&keyword;
          keyword._M_string_length = (size_type)&keyword;
          std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                    ((list<unsigned_long,_std::allocator<unsigned_long>_> *)&keyword,&bb_addr);
          local_e0 = &keyword;
          while( true ) {
            pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_e0->_M_dataplus)._M_p;
            if (pbVar3 == &keyword) break;
            term_type._M_dataplus._M_p = (pointer)(pbVar3->field_2)._M_allocated_capacity;
            local_e0 = pbVar3;
            if (term_type._M_dataplus._M_p == (pointer)0x0) {
              __assert_fail("addr != 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/BFTraceReader.cpp"
                            ,0x8a,"virtual void BFTraceReader::loadCFGs()");
            }
            iVar6 = std::
                    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_BFTraceReader::BasicBlock>,_std::_Select1st<std::pair<const_unsigned_long,_BFTraceReader::BasicBlock>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_BFTraceReader::BasicBlock>_>_>
                    ::find(&(pSVar5->blocks)._M_t,(key_type *)&term_type);
            if ((_Rb_tree_header *)iVar6._M_node ==
                &(pSVar5->blocks)._M_t._M_impl.super__Rb_tree_header) {
              __assert_fail("sym->blocks.find(addr) != sym->blocks.end()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/BFTraceReader.cpp"
                            ,0x8c,"virtual void BFTraceReader::loadCFGs()");
            }
            pmVar7 = std::
                     map<unsigned_long,_BFTraceReader::BasicBlock,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_BFTraceReader::BasicBlock>_>_>
                     ::operator[](&pSVar5->blocks,(key_type *)&term_type);
            this_02 = CFG::nodeByAddr(this_01,(Addr)term_type._M_dataplus._M_p);
            if (this_02 == (CfgNode *)0x0) {
              this_02 = (CfgNode *)operator_new(0x18);
              CfgNode::CfgNode(this_02,CFG_BLOCK);
              pBVar8 = (BlockData *)operator_new(0x90);
              CfgNode::BlockData::BlockData
                        (pBVar8,(Addr)term_type._M_dataplus._M_p,pmVar7->size,false);
              CfgNode::setData(this_02,(Data *)pBVar8);
              CFG::addNode(this_01,this_02);
            }
            else {
              if (this_02->m_type != CFG_PHANTOM) {
                __assert_fail("node->type() == CfgNode::CFG_PHANTOM",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/BFTraceReader.cpp"
                              ,0x95,"virtual void BFTraceReader::loadCFGs()");
              }
              pBVar8 = (BlockData *)operator_new(0x90);
              CfgNode::BlockData::BlockData
                        (pBVar8,(Addr)term_type._M_dataplus._M_p,pmVar7->size,false);
              CfgNode::setData(this_02,(Data *)pBVar8);
            }
            if (term_type._M_dataplus._M_p == (pointer)bb_addr) {
              if (this_01->m_entryNode != (CfgNode *)0x0) {
                __assert_fail("cfg->entryNode() == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/BFTraceReader.cpp"
                              ,0x9a,"virtual void BFTraceReader::loadCFGs()");
              }
              pCVar9 = CFGReader::entryNode(this_01);
              CFG::addEdge(this_01,pCVar9,this_02,0);
            }
            if ((pmVar7->is_exit != false) || (pmVar7->type == RETURN)) {
              pCVar9 = CFGReader::exitNode(this_01);
              CFG::addEdge(this_01,this_02,pCVar9,0);
            }
            pmVar10 = std::
                      map<unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
                      ::operator[](&pSVar5->edges,(key_type *)&term_type);
            for (p_Var12 = (pmVar10->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
                (_Rb_tree_header *)p_Var12 != &(pmVar10->_M_t)._M_impl.super__Rb_tree_header;
                p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12)) {
              dst_1 = *(Addr *)(p_Var12 + 1);
              pCVar9 = CFGReader::nodeWithAddr(this_01,dst_1);
              CFG::addEdge(this_01,this_02,pCVar9,0);
              _Var11 = std::
                       __find_if<std::_List_iterator<unsigned_long>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_long_const>>
                                 (keyword._M_dataplus._M_p,&keyword,&dst_1);
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  _Var11._M_node == &keyword) {
                std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                          ((list<unsigned_long,_std::allocator<unsigned_long>_> *)&keyword,&dst_1);
              }
            }
          }
          CFG::check(this_01);
          std::__cxx11::_List_base<unsigned_long,_std::allocator<unsigned_long>_>::_M_clear
                    ((_List_base<unsigned_long,_std::allocator<unsigned_long>_> *)&keyword);
        }
        if (pSVar5 != (Symbol *)0x0) {
          Symbol::~Symbol(pSVar5);
        }
        operator_delete(pSVar5);
      } while( true );
    }
    std::__cxx11::string::string((string *)&keyword,(string *)psVar1);
    matchToken(this,TKN_KEYWORD);
    bVar4 = std::operator==(&keyword,"symbol");
    if (bVar4) {
      pSVar5 = (Symbol *)operator_new(0xe8);
      memset(pSVar5,0,0xe8);
      Symbol::Symbol(pSVar5);
      sym = pSVar5;
      std::__cxx11::list<BFTraceReader::Symbol_*,_std::allocator<BFTraceReader::Symbol_*>_>::
      push_back(&symbols,&sym);
      sym->start = (Addr)(this->m_current).data;
      matchToken(this,TKN_ADDR);
      sym->end = (Addr)(this->m_current).data;
      matchToken(this,TKN_ADDR);
      std::__cxx11::string::_M_assign((string *)&sym->filename);
      matchToken(this,TKN_STRING);
      std::__cxx11::string::_M_assign((string *)&sym->functname);
      matchToken(this,TKN_STRING);
      sym->bias = (Addr)(this->m_current).data;
LAB_0010a2e5:
      matchToken(this,TKN_ADDR);
    }
    else {
      bVar4 = std::operator==(&keyword,"program-entry");
      if (bVar4) {
        sym = (Symbol *)0x0;
LAB_0010a2d9:
        matchToken(this,TKN_ADDR);
        goto LAB_0010a2e5;
      }
      bVar4 = std::operator==(&keyword,"block");
      if (bVar4) {
        if (sym == (Symbol *)0x0) {
          __assertion = "sym != 0";
          __line = 0x44;
LAB_0010a977:
          __assert_fail(__assertion,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/BFTraceReader.cpp"
                        ,__line,"virtual void BFTraceReader::loadCFGs()");
        }
        AVar2 = (this->m_current).data.addr;
        matchToken(this,TKN_ADDR);
        if (AVar2 != sym->start) {
          __assertion = "faddr == sym->start";
          __line = 0x48;
          goto LAB_0010a977;
        }
        bb_addr = (this->m_current).data.addr;
        matchToken(this,TKN_ADDR);
        local_e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::
                   map<unsigned_long,_BFTraceReader::BasicBlock,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_BFTraceReader::BasicBlock>_>_>
                   ::operator[](&sym->blocks,&bb_addr);
        AVar2 = (this->m_current).data.addr;
        matchToken(this,TKN_ADDR);
        *(int *)&(local_e0->_M_dataplus)._M_p = (int)AVar2 - (int)bb_addr;
        matchToken(this,TKN_ADDR);
        std::__cxx11::string::string((string *)&term_type,(string *)psVar1);
        matchToken(this,TKN_KEYWORD);
        bVar4 = std::operator==(&term_type,"jump");
        uVar14 = 0;
        if (!bVar4) {
          bVar4 = std::operator==(&term_type,"call");
          uVar14 = 1;
          if (!bVar4) {
            bVar4 = std::operator==(&term_type,"return");
            uVar14 = 2;
            if (!bVar4) {
              bVar4 = std::operator==(&term_type,"other");
              uVar14 = 3;
              if (!bVar4) {
                __assertion = "term_type == \"other\"";
                __line = 0x5d;
                goto LAB_0010a977;
              }
            }
          }
        }
        *(undefined4 *)((long)&(local_e0->_M_dataplus)._M_p + 4) = uVar14;
        bVar4 = (this->m_current).data.boolean;
        matchToken(this,TKN_BOOL);
        if (bVar4 != false) {
          std::
          _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
          ::_M_insert_unique<unsigned_long_const&>
                    ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                      *)&sym->entries,&bb_addr);
        }
        bVar4 = (this->m_current).data.boolean;
        matchToken(this,TKN_BOOL);
        *(bool *)&local_e0->_M_string_length = bVar4;
        std::__cxx11::string::~string((string *)&term_type);
      }
      else {
        bVar4 = std::operator==(&keyword,"call");
        if ((bVar4) || (bVar4 = std::operator==(&keyword,"return"), bVar4)) goto LAB_0010a2d9;
        bVar4 = std::operator==(&keyword,"br");
        if (!bVar4) {
          __assertion = "false";
          __line = 0x7a;
          goto LAB_0010a977;
        }
        if (sym == (Symbol *)0x0) {
          __assertion = "sym != 0";
          __line = 0x70;
          goto LAB_0010a977;
        }
        term_type._M_dataplus._M_p = *(pointer *)&(this->m_current).data;
        matchToken(this,TKN_ADDR);
        bb_addr = (this->m_current).data.addr;
        matchToken(this,TKN_ADDR);
        this_00 = (_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                   *)std::
                     map<unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
                     ::operator[](&sym->edges,(key_type *)&term_type);
        std::
        _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
        ::_M_insert_unique<unsigned_long_const&>(this_00,&bb_addr);
      }
    }
    std::__cxx11::string::~string((string *)&keyword);
  } while( true );
}

Assistant:

void BFTraceReader::loadCFGs() {
	Symbol* sym = 0;
	std::list<Symbol*> symbols;

	while (m_current.type == InputTokenizer::Lexeme::TKN_KEYWORD) {
		std::string keyword = m_current.token;
		matchToken(InputTokenizer::Lexeme::TKN_KEYWORD);

		if (keyword == "symbol") {
			sym = new Symbol();
			symbols.push_back(sym);

			sym->start = m_current.data.addr;
			matchToken(InputTokenizer::Lexeme::TKN_ADDR);

			sym->end = m_current.data.addr;
			matchToken(InputTokenizer::Lexeme::TKN_ADDR);

			sym->filename = m_current.token;
			matchToken(InputTokenizer::Lexeme::TKN_STRING);

			sym->functname = m_current.token;
			matchToken(InputTokenizer::Lexeme::TKN_STRING);

			sym->bias = m_current.data.addr;
			matchToken(InputTokenizer::Lexeme::TKN_ADDR);
		} else if (keyword == "program-entry") {
			sym = 0;
			matchToken(InputTokenizer::Lexeme::TKN_ADDR);
			matchToken(InputTokenizer::Lexeme::TKN_ADDR);
		} else if (keyword == "block") {
			assert(sym != 0);

			Addr faddr = m_current.data.addr;
			matchToken(InputTokenizer::Lexeme::TKN_ADDR);
			assert(faddr == sym->start);

			Addr bb_addr = m_current.data.addr;
			matchToken(InputTokenizer::Lexeme::TKN_ADDR);
			BasicBlock& bb = sym->blocks[bb_addr];

			Addr bb_end = m_current.data.addr;
			matchToken(InputTokenizer::Lexeme::TKN_ADDR);
			bb.size = bb_end - bb_addr;

			matchToken(InputTokenizer::Lexeme::TKN_ADDR);

			std::string term_type = m_current.token;
			matchToken(InputTokenizer::Lexeme::TKN_KEYWORD);
			if (term_type == "jump")
				bb.type = BFTraceReader::JUMP;
			else if (term_type == "call")
				bb.type = BFTraceReader::CALL;
			else if (term_type == "return")
				bb.type = BFTraceReader::RETURN;
			else {
				assert(term_type == "other");
				bb.type = BFTraceReader::OTHER;
			}

			bool is_entry = m_current.data.boolean;
			matchToken(InputTokenizer::Lexeme::TKN_BOOL);
			if (is_entry)
				sym->entries.insert(bb_addr);

			bool is_exit = m_current.data.boolean;
			matchToken(InputTokenizer::Lexeme::TKN_BOOL);
			bb.is_exit = is_exit;
		} else if (keyword == "call") {
			matchToken(InputTokenizer::Lexeme::TKN_ADDR);
			matchToken(InputTokenizer::Lexeme::TKN_ADDR);
		} else if (keyword == "return") {
			matchToken(InputTokenizer::Lexeme::TKN_ADDR);
			matchToken(InputTokenizer::Lexeme::TKN_ADDR);
		} else if (keyword == "br") {
			assert(sym != 0);

			Addr src = m_current.data.addr;
			matchToken(InputTokenizer::Lexeme::TKN_ADDR);

			Addr dst = m_current.data.addr;
			matchToken(InputTokenizer::Lexeme::TKN_ADDR);

			sym->edges[src].insert(dst);
		} else {
			assert(false);
		}
	}

	matchToken(InputTokenizer::Lexeme::TKN_EOF);

	for (Symbol* sym : symbols) {
		for (Addr entry : sym->entries) {
			CFG* cfg = this->instance(entry);
			cfg->setFunctionName(sym->filename + "::" + sym->functname);

			std::list<Addr> nodes;
			nodes.push_back(entry);
			for (std::list<Addr>::iterator it = nodes.begin(), ed = nodes.end();
					it != ed; ++it) {
				Addr addr = *it;
				assert(addr != 0);

				assert(sym->blocks.find(addr) != sym->blocks.end());
				BasicBlock& bb = sym->blocks[addr];

				CfgNode* node = cfg->nodeByAddr(addr);
				if (node == 0) {
					node = new CfgNode(CfgNode::CFG_BLOCK);
					node->setData(new CfgNode::BlockData(addr, bb.size));
					cfg->addNode(node);
				} else {
					assert(node->type() == CfgNode::CFG_PHANTOM);
					node->setData(new CfgNode::BlockData(addr, bb.size));
				}

				if (addr == entry) {
					assert(cfg->entryNode() == 0);
					CfgNode* entry = CFGReader::entryNode(cfg);
					cfg->addEdge(entry, node);
				}

				if (bb.is_exit || bb.type == BFTraceReader::RETURN) {
					CfgNode* exit = CFGReader::exitNode(cfg);
					cfg->addEdge(node, exit);
				}

				for (Addr dst : sym->edges[addr]) {
					cfg->addEdge(node, CFGReader::nodeWithAddr(cfg, dst));

					if (std::find(nodes.begin(), ed, dst) == ed)
						nodes.push_back(dst);
				}
			}

			cfg->check();
		}

		delete sym;
	}
}